

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvtkmesh.cpp
# Opt level: O2

void __thiscall
TPZVTKGraphMesh::TPZVTKGraphMesh
          (TPZVTKGraphMesh *this,TPZCompMesh *cmesh,int dimension,
          set<int,_std::less<int>,_std::allocator<int>_> *matids,
          TPZVec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *scalnames,
          TPZVec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *vecnames,
          TPZVec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *tensnames)

{
  TPZGraphMesh::TPZGraphMesh
            (&this->super_TPZGraphMesh,&PTR_PTR_017a5000,cmesh,dimension,matids,scalnames,vecnames,
             tensnames);
  (this->super_TPZGraphMesh).super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZVTKGraphMesh_017a4f60;
  this->fNumCases = 0;
  this->fNumSteps = 0;
  (this->super_TPZGraphMesh).fStyle = EVTKStyle;
  TPZVec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator=(&(this->super_TPZGraphMesh).fVecNames,vecnames);
  TPZVec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator=(&(this->super_TPZGraphMesh).fScalarNames,scalnames);
  TPZVec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator=(&(this->super_TPZGraphMesh).fTensorNames,tensnames);
  return;
}

Assistant:

TPZVTKGraphMesh::TPZVTKGraphMesh(TPZCompMesh *cmesh, int dimension, const std::set<int> & matids, const TPZVec<std::string> &scalnames, const TPZVec<std::string> &vecnames, const TPZVec<std::string> &tensnames): TPZGraphMesh(cmesh, dimension, matids,scalnames,vecnames,tensnames) {
    fNumCases = 0;
    fNumSteps = 0;
    fStyle = EVTKStyle;
    fVecNames = vecnames;
    fScalarNames = scalnames;
    fTensorNames = tensnames;
}